

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O0

void __thiscall ot::commissioner::Crc16::Update(Crc16 *this,uint8_t aByte)

{
  char local_12;
  uint8_t i;
  uint8_t aByte_local;
  Crc16 *this_local;
  
  this->mCrc = this->mCrc ^ (ushort)aByte << 8;
  local_12 = '\b';
  do {
    if ((this->mCrc & 0x8000) == 0) {
      this->mCrc = this->mCrc << 1;
    }
    else {
      this->mCrc = this->mCrc << 1 ^ this->mPolynomial;
    }
    local_12 = local_12 + -1;
  } while (local_12 != '\0');
  return;
}

Assistant:

void Crc16::Update(uint8_t aByte)
{
    uint8_t i;

    mCrc = mCrc ^ static_cast<uint16_t>(aByte << 8);
    i    = 8;

    do
    {
        if (mCrc & 0x8000)
        {
            mCrc = static_cast<uint16_t>(mCrc << 1) ^ mPolynomial;
        }
        else
        {
            mCrc = static_cast<uint16_t>(mCrc << 1);
        }
    } while (--i);
}